

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O2

bool __thiscall
r_comp::Compiler::local_reference(Compiler *this,Ptr *node,uint16_t *index,ReturnType t)

{
  bool bVar1;
  iterator iVar2;
  
  iVar2 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Reference>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Reference>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->local_references)._M_h,
                 &((node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr)->cmd);
  if ((iVar2.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Reference>,_true>
       ._M_cur == (__node_type *)0x0) ||
     ((t != ANY &&
      (*(ReturnType *)
        ((long)iVar2.
               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Reference>,_true>
               ._M_cur + 0x70) != t)))) {
    bVar1 = false;
  }
  else {
    *index = *(uint16_t *)
              ((long)iVar2.
                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Reference>,_true>
                     ._M_cur + 0x28);
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool Compiler::local_reference(RepliStruct::Ptr node, uint16_t &index, const ReturnType t)
{
    std::unordered_map<std::string, Reference>::iterator it = local_references.find(node->cmd);

    if (it != local_references.end() && (t == ANY || (t != ANY && it->second._class.type == t))) {
        index = it->second.index;
        return true;
    }

    return false;
}